

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.hpp
# Opt level: O2

double __thiscall Instance::objval(Instance *this,QpVector *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  QpVector local_50;
  
  dVar2 = QpVector::dot(&this->c,x);
  MatrixBase::vec_mat(&local_50,&(this->Q).mat,x);
  dVar3 = QpVector::dot(&local_50,x);
  dVar1 = this->offset;
  QpVector::~QpVector(&local_50);
  return dVar3 * 0.5 + dVar2 + dVar1;
}

Assistant:

double objval(const QpVector& x) {
    return c * x + 0.5 * (Q.vec_mat(x) * x) + offset;
  }